

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  void *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *__s;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *__a;
  Scalar *x;
  char q;
  double t;
  int i;
  Mat Normalmap;
  Mat Depthmap;
  Vector4f cam_params;
  float cy;
  float cx;
  float fy;
  float fx;
  Affine3d Tcam;
  Affine3d T;
  Vector4d geometryParam;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> geometry;
  Mat *in_stack_fffffffffffff038;
  Mat *v0;
  undefined4 in_stack_fffffffffffff040;
  undefined4 in_stack_fffffffffffff044;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_fffffffffffff048;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_fffffffffffff050;
  Scalar *in_stack_fffffffffffff058;
  Scalar *z;
  Torus *in_stack_fffffffffffff060;
  Scalar *y;
  Scalar *in_stack_fffffffffffff068;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffff070;
  Mat local_f18 [240];
  AngleAxis<double> *in_stack_fffffffffffff1d8;
  _InputArray local_db8 [31];
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_d99;
  string local_d98 [32];
  Mat local_d78 [128];
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_fffffffffffff308;
  float in_stack_fffffffffffff310;
  float in_stack_fffffffffffff314;
  float in_stack_fffffffffffff318;
  int in_stack_fffffffffffff31c;
  Vector4f *in_stack_fffffffffffff320;
  int in_stack_fffffffffffff328;
  int in_stack_fffffffffffff32c;
  Affine3d *in_stack_fffffffffffff330;
  Mat *in_stack_fffffffffffff340;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_fffffffffffff3e8;
  float in_stack_fffffffffffff3f4;
  float in_stack_fffffffffffff3f8;
  int in_stack_fffffffffffff3fc;
  Vector4f *in_stack_fffffffffffff400;
  int in_stack_fffffffffffff408;
  int in_stack_fffffffffffff40c;
  Affine3d *in_stack_fffffffffffff410;
  Mat *in_stack_fffffffffffff420;
  _InputArray local_a98 [31];
  undefined1 local_a79 [113];
  double local_a08;
  double local_968;
  double local_960;
  double local_958;
  double local_938;
  int local_92c;
  Mat local_928 [96];
  Mat local_8c8 [112];
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  Scalar *local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_690;
  undefined8 local_638;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  void *local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  void *local_370;
  undefined8 local_318;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  void *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> local_28;
  int local_4;
  
  local_4 = 0;
  std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::vector
            ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)0x15751e);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x15752b);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  local_f8 = 0;
  local_100 = 0;
  local_108 = 0xbff0000000000000;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,(Scalar *)in_stack_fffffffffffff060
             ,in_stack_fffffffffffff058);
  Eigen::Transform<double,_3,_2,_0>::translation
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff038);
  local_160 = 0x4010000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            (in_stack_fffffffffffff048,
             (Scalar *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  local_168 = 0x4010000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_170 = 0x4020000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_178 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x15767e);
  pvVar2 = operator_new(0xb0);
  sdf::Box::Box((Box *)in_stack_fffffffffffff060,
                (operation_t)((ulong)in_stack_fffffffffffff058 >> 0x20),
                (Affine3d *)in_stack_fffffffffffff050,(Vector4d *)in_stack_fffffffffffff048,
                SUB41((uint)in_stack_fffffffffffff044 >> 0x18,0));
  local_180 = pvVar2;
  std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::push_back
            ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (value_type *)in_stack_fffffffffffff038);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::Transform<double,_3,_2,_0>::operator=
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (Transform<double,_3,_2,_0> *)in_stack_fffffffffffff038);
  local_230 = 0x3ff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            (in_stack_fffffffffffff048,
             (Scalar *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  local_238 = 0x4000000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_240 = 0x3fe0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_248 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x1577c9);
  local_268 = 0xbff0000000000000;
  local_270 = 0x3ff0000000000000;
  local_278 = 0x400199999999999a;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,(Scalar *)in_stack_fffffffffffff060
             ,in_stack_fffffffffffff058);
  Eigen::Transform<double,_3,_2,_0>::translation
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff038);
  local_318 = 0xbfe0c152382d7365;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::AngleAxis<double>::toRotationMatrix(in_stack_fffffffffffff1d8);
  Eigen::Transform<double,_3,_2,_0>::linear
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff038);
  pvVar2 = operator_new(0xb0);
  sdf::Box::Box((Box *)in_stack_fffffffffffff060,
                (operation_t)((ulong)in_stack_fffffffffffff058 >> 0x20),
                (Affine3d *)in_stack_fffffffffffff050,(Vector4d *)in_stack_fffffffffffff048,
                SUB41((uint)in_stack_fffffffffffff044 >> 0x18,0));
  local_370 = pvVar2;
  std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::push_back
            ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (value_type *)in_stack_fffffffffffff038);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::Transform<double,_3,_2,_0>::operator=
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (Transform<double,_3,_2,_0> *)in_stack_fffffffffffff038);
  local_418 = 0x3ff0000000000000;
  local_420 = 0x3ff8000000000000;
  local_428 = 0x4000000000000000;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,(Scalar *)in_stack_fffffffffffff060
             ,in_stack_fffffffffffff058);
  Eigen::Transform<double,_3,_2,_0>::translation
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff038);
  local_480 = 0x3fe0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            (in_stack_fffffffffffff048,
             (Scalar *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  local_488 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_490 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_498 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x157a8c);
  pvVar2 = operator_new(0xb0);
  sdf::Sphere::Sphere((Sphere *)in_stack_fffffffffffff060,
                      (operation_t)((ulong)in_stack_fffffffffffff058 >> 0x20),
                      (Affine3d *)in_stack_fffffffffffff050,(Vector4d *)in_stack_fffffffffffff048,
                      SUB41((uint)in_stack_fffffffffffff044 >> 0x18,0));
  local_4a0 = pvVar2;
  std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::push_back
            ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (value_type *)in_stack_fffffffffffff038);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::Transform<double,_3,_2,_0>::operator=
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (Transform<double,_3,_2,_0> *)in_stack_fffffffffffff038);
  local_550 = 0x3fe3333333333333;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            (in_stack_fffffffffffff048,
             (Scalar *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  local_558 = 0x3fe3333333333333;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_560 = 0x3fe3333333333333;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_568 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x157bc0);
  local_588 = 0x3fe0000000000000;
  local_590 = 0x3ff6666666666666;
  local_598 = 0x3fe0000000000000;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,(Scalar *)in_stack_fffffffffffff060
             ,in_stack_fffffffffffff058);
  Eigen::Transform<double,_3,_2,_0>::translation
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff038);
  local_638 = 0x3fc657184ae74487;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitY();
  Eigen::AngleAxis<double>::
  AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
            ((AngleAxis<double> *)in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048,
             (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
              *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::AngleAxis<double>::toRotationMatrix(in_stack_fffffffffffff1d8);
  Eigen::Transform<double,_3,_2,_0>::linear
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff038);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0xb0);
  sdf::Box::Box((Box *)in_stack_fffffffffffff060,
                (operation_t)((ulong)in_stack_fffffffffffff058 >> 0x20),
                (Affine3d *)in_stack_fffffffffffff050,(Vector4d *)in_stack_fffffffffffff048,
                SUB41((uint)in_stack_fffffffffffff044 >> 0x18,0));
  local_690 = this;
  std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::push_back
            ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (value_type *)in_stack_fffffffffffff038);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  Eigen::Transform<double,_3,_2,_0>::operator=
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (Transform<double,_3,_2,_0> *)in_stack_fffffffffffff038);
  local_738 = 0x3fe0000000000000;
  local_740 = 0;
  local_748 = 0x4002000000000000;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,(Scalar *)in_stack_fffffffffffff060
             ,in_stack_fffffffffffff058);
  Eigen::Transform<double,_3,_2,_0>::translation
            ((Transform<double,_3,_2,_0> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff038);
  local_7a0 = 0x3fe0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            (in_stack_fffffffffffff048,
             (Scalar *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  local_7a8 = 0x3fb999999999999a;
  __s = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                  (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_7b0 = 0;
  __a = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                  (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  local_7b8 = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x157e79);
  x = (Scalar *)operator_new(0xb0);
  sdf::Torus::Torus(in_stack_fffffffffffff060,
                    (operation_t)((ulong)in_stack_fffffffffffff058 >> 0x20),
                    (Affine3d *)in_stack_fffffffffffff050,(Vector4d *)in_stack_fffffffffffff048,
                    SUB41((uint)in_stack_fffffffffffff044 >> 0x18,0));
  local_7c0 = x;
  std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::push_back
            ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)
             CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
             (value_type *)in_stack_fffffffffffff038);
  Eigen::Transform<double,_3,_2,_0>::Identity();
  local_84c = 0x43960000;
  local_850 = 0x43960000;
  local_854 = 0x439fc000;
  local_858 = 0x436f8000;
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<float,_4,_1,_0,_4,_1> *)__a,(Scalar *)x,(Scalar *)in_stack_fffffffffffff060,
             (Scalar *)in_stack_fffffffffffff058,(Scalar *)in_stack_fffffffffffff050);
  cv::Mat::Mat(local_8c8);
  cv::Mat::Mat(local_928);
  local_92c = -0x96;
  while( true ) {
    if (0x3b < local_92c) {
      cv::waitKey(0);
      local_4 = 0;
      cv::Mat::~Mat(local_928);
      cv::Mat::~Mat(local_8c8);
      std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::~vector
                ((vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *)
                 in_stack_fffffffffffff050);
      return local_4;
    }
    local_938 = (double)local_92c;
    z = (Scalar *)0x402921fb54442d18;
    y = (Scalar *)0x4066800000000000;
    local_958 = cos((local_938 * 12.566370614359172) / 180.0);
    local_960 = sin((local_938 * (double)z) / (double)y);
    local_960 = local_960 * 0.6;
    local_968 = local_938 * 0.01;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)__a,x,y,z);
    Eigen::Transform<double,_3,_2,_0>::translation
              ((Transform<double,_3,_2,_0> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff038);
    local_a08 = ((double)local_92c * 3.141592653589793) / 50.0;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitX();
    Eigen::AngleAxis<double>::
    AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
              ((AngleAxis<double> *)in_stack_fffffffffffff050,(Scalar *)in_stack_fffffffffffff048,
               (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
                *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    Eigen::AngleAxis<double>::toRotationMatrix(in_stack_fffffffffffff1d8);
    Eigen::Transform<double,_3,_2,_0>::linear
              ((Transform<double,_3,_2,_0> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,3,3,false>::operator=
              ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff038);
    std::vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>::operator[](&local_28,4);
    Eigen::Transform<double,_3,_2,_0>::operator=
              ((Transform<double,_3,_2,_0> *)
               CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (Transform<double,_3,_2,_0> *)in_stack_fffffffffffff038);
    v0 = local_928;
    sdf::RenderNormal(in_stack_fffffffffffff410,in_stack_fffffffffffff40c,in_stack_fffffffffffff408,
                      in_stack_fffffffffffff400,in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8,
                      in_stack_fffffffffffff3f4,in_stack_fffffffffffff3e8,in_stack_fffffffffffff420)
    ;
    in_stack_fffffffffffff050 = (CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_a79
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
               (double)v0);
    cv::operator*(local_d78,0.5);
    cv::operator-((Scalar_ *)&stack0xfffffffffffff408,(MatExpr *)&stack0xfffffffffffff3e8);
    cv::_InputArray::_InputArray(local_a98,(MatExpr *)&stack0xfffffffffffff408);
    cv::imshow((string *)(local_a79 + 1),local_a98);
    cv::_InputArray::~_InputArray(local_a98);
    cv::MatExpr::~MatExpr((MatExpr *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    cv::MatExpr::~MatExpr((MatExpr *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    std::__cxx11::string::~string((string *)(local_a79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a79);
    in_stack_fffffffffffff038 = local_8c8;
    sdf::RenderDepth(in_stack_fffffffffffff330,in_stack_fffffffffffff32c,in_stack_fffffffffffff328,
                     in_stack_fffffffffffff320,in_stack_fffffffffffff31c,in_stack_fffffffffffff318,
                     in_stack_fffffffffffff314,in_stack_fffffffffffff310,in_stack_fffffffffffff308,
                     in_stack_fffffffffffff340);
    in_stack_fffffffffffff048 = &local_d99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
    cv::operator/(local_f18,10.0);
    cv::_InputArray::_InputArray(local_db8,(MatExpr *)local_f18);
    cv::imshow(local_d98,local_db8);
    cv::_InputArray::~_InputArray(local_db8);
    cv::MatExpr::~MatExpr((MatExpr *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
    std::__cxx11::string::~string(local_d98);
    std::allocator<char>::~allocator((allocator<char> *)&local_d99);
    in_stack_fffffffffffff044 = cv::waitKey(2);
    cVar1 = (char)in_stack_fffffffffffff044;
    if (((cVar1 == 'q') || (cVar1 == '\x1b')) || (cVar1 == 'G')) break;
    local_92c = local_92c + 1;
  }
  exit(0);
}

Assistant:

int main( int argc, char* argv[] )
{

//-----------------------------------------------------------------------------    
// Define geometry of the world
//-------------------------------------------------------------------------
    std::vector<sdf::Primitive*> geometry;
    Eigen::Vector4d geometryParam;

    // Create the room
    Eigen::Affine3d T = Eigen::Affine3d::Identity();
    T.translation() = Eigen::Vector3d(0.0, 0.0, -1.0);
    geometryParam << 4.0, 4.0, 8.0, 0.0; //dimensions in X Y Z
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , true)); //the last flag flips the sign of the box

    // Add a box inside
    T = Eigen::Affine3d::Identity();
    geometryParam << 1.0, 2.0, 0.5, 0.0; //dimensions in X Y Z
    T.translation() = Eigen::Vector3d(-1.0, 1.0, 2.2);
    T.linear() = (  Eigen::AngleAxisd(-M_PI*30/180, Eigen::Vector3d::UnitY())).toRotationMatrix(); 
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , false));
        
    //Add a Sphere
    T = Eigen::Affine3d::Identity();
    T.translation() = Eigen::Vector3d(1.0, 1.5, 2.0);
    geometryParam << 0.5, 0.0, 0.0, 0.0; // Radius
    geometry.push_back(new sdf::Sphere( sdf::bool_union, T, geometryParam , false));
    T = Eigen::Affine3d::Identity();
   
    //Add another Box
    geometryParam << 0.6, 0.6, 0.6, 0.0; //dimensions in X Y Z
    T.translation() = Eigen::Vector3d(0.5, 2-0.6, 0.5);
    T.linear() = (  Eigen::AngleAxisd(M_PI*10/180, Eigen::Vector3d::UnitY())).toRotationMatrix(); 
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , false));
    T = Eigen::Affine3d::Identity();

    //Add a torus
    T.translation() = Eigen::Vector3d(0.5, 0, 2.25);
    geometryParam << 0.50, 0.1, 0.0, 0.0; // radius of ring, radius of cross-section
    geometry.push_back(new sdf::Torus( sdf::bool_union, T, geometryParam , false));
//-----------------------------------------------------------------------------    
//Define a camera to use as sensor
//-----------------------------------------------------------------------------    
    Eigen::Affine3d Tcam = Eigen::Affine3d::Identity();

    float fx = 300;
    float fy = 300;
    float cx = 319.5;
    float cy = 239.5;

    // focalx,focaly,centerx,centery (image size is determined by Render() fcn )
    Eigen::Vector4f cam_params(fx, fy, cx, cy);

    cv::Mat Depthmap;
    cv::Mat Normalmap;

//-----------------------------------------------------------------------------    
//Do some rendering and animation
//-----------------------------------------------------------------------------    
    // A simple animation loop
      
    for (int i = -150; i < 60; ++i)
    {
      //time steps      
      double t = double(i);

      // move the camera in an elliptic 3D spiral with pure translation (X Y Z)
      Tcam.translation() = Eigen::Vector3d( 
          cos(4*M_PI*t/180), 
          0.6*sin(4*M_PI*t/180), 
          t*0.01);

      //change the rotation for one of the objects at each iteration
      T.linear() = ( 
                    //Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitZ()) *   
                    //Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitY()) * 
                    Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitX()) 
                    ).toRotationMatrix(); //rotation about X 
      geometry[4]->transformation = T;

      
      //Render Normal-map from synthetic environment 
      sdf::RenderNormal(Tcam, 480, 640, cam_params, 32, 10, 0.05, geometry,Normalmap);
      cv::imshow("Normals", 0.5-Normalmap*0.5);
    
      //Render Depth image from synthetic environment     
      sdf::RenderDepth(Tcam, 480, 640, cam_params, 32, 10, 0.4, 0.05, geometry,Depthmap);      
      cv::imshow("Depth", Depthmap/10.0);
      char q = cv::waitKey(2);

    if(q == 'q' || q  == 27 || q  == 71 ) { exit(0); }

    }
    cv::waitKey();
   return 0;
}